

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O2

void __thiscall dynet::AdagradTrainer::restart(AdagradTrainer *this)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  pointer pSVar4;
  ShadowParameters sp;
  ShadowLookupParameters local_78;
  
  pSVar1 = (this->vp).
           super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar4 = (this->vp).
                super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
    local_78.all_h.d.d._0_8_ = *(undefined8 *)(pSVar4->h).d.d;
    local_78.all_h.d.d._8_8_ = *(undefined8 *)((pSVar4->h).d.d + 2);
    local_78.all_h.d.d._16_8_ = *(undefined8 *)((pSVar4->h).d.d + 4);
    local_78.all_h.d._24_8_ = *(undefined8 *)((pSVar4->h).d.d + 6);
    local_78.all_h._32_8_ = *(undefined8 *)&(pSVar4->h).d.bd;
    local_78.all_h.v = (pSVar4->h).v;
    local_78.all_h.device = (pSVar4->h).device;
    local_78.all_h.mem_pool = (pSVar4->h).mem_pool;
    local_78.all_h._60_4_ = *(undefined4 *)&(pSVar4->h).field_0x3c;
    TensorTools::zero(&local_78.all_h);
  }
  pSVar2 = (this->vlp).
           super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar3 = (this->vlp).
                super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar2; pSVar3 = pSVar3 + 1) {
    ShadowLookupParameters::ShadowLookupParameters(&local_78,pSVar3);
    TensorTools::zero(&local_78.all_h);
    std::_Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>::~_Vector_base
              (&local_78.h.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>);
  }
  return;
}

Assistant:

void AdagradTrainer::restart() {
  for (auto sp : vp)
    TensorTools::zero(sp.h);
  for (auto slp : vlp)
    TensorTools::zero(slp.all_h);
}